

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDEdgeSurfaceCurve * __thiscall
ON_SubDHeap::CopyEdgeSurfaceCurve
          (ON_SubDHeap *this,ON_SubDEdge *source_edge,ON_SubDEdge *desination_edge)

{
  bool bVar1;
  byte bVar2;
  uint local_64;
  ON_SubDEdgeSurfaceCurve *local_60;
  size_t szx;
  size_t sz9;
  ON_SubDEdgeSurfaceCurve *desination_curve;
  uchar cv_count;
  ON_SubDEdgeSurfaceCurve *source_curve;
  ON_SubDEdge *desination_edge_local;
  ON_SubDEdge *source_edge_local;
  ON_SubDHeap *this_local;
  
  if ((desination_edge == (ON_SubDEdge *)0x0) || (source_edge == desination_edge)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDHeap *)0x0;
  }
  else {
    ON_SubDComponentBase::Internal_ClearSurfacePointFlag
              (&desination_edge->super_ON_SubDComponentBase);
    if (source_edge->m_limit_curve == desination_edge->m_limit_curve) {
      desination_edge->m_limit_curve = (ON_SubDEdgeSurfaceCurve *)0x0;
    }
    else if (desination_edge->m_limit_curve != (ON_SubDEdgeSurfaceCurve *)0x0) {
      desination_edge->m_limit_curve->m_cv_count = '\0';
    }
    if (source_edge == (ON_SubDEdge *)0x0) {
      ReturnEdgeSurfaceCurve(this,desination_edge);
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDHeap *)0x0;
    }
    else {
      bVar1 = ON_SubDComponentBase::Internal_SurfacePointFlag
                        (&source_edge->super_ON_SubDComponentBase);
      if (bVar1) {
        local_60 = source_edge->m_limit_curve;
      }
      else {
        local_60 = (ON_SubDEdgeSurfaceCurve *)0x0;
      }
      if (local_60 == (ON_SubDEdgeSurfaceCurve *)0x0) {
        local_64 = 0;
      }
      else {
        local_64 = (uint)local_60->m_cv_count;
      }
      bVar2 = (byte)local_64;
      if (bVar2 == 0) {
        ON_SubDComponentBase::Internal_ClearSurfacePointFlag
                  (&source_edge->super_ON_SubDComponentBase);
        ReturnEdgeSurfaceCurve(this,desination_edge);
        this_local = (ON_SubDHeap *)0x0;
      }
      else if (((bVar2 < 2) || (0x13 < bVar2)) ||
              ((9 < bVar2 && (local_60->m_cvx == (double *)0x0)))) {
        ON_SubDComponentBase::Internal_ClearSurfacePointFlag
                  (&source_edge->super_ON_SubDComponentBase);
        ReturnEdgeSurfaceCurve(this,desination_edge);
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDHeap *)0x0;
      }
      else {
        sz9 = (size_t)desination_edge->m_limit_curve;
        if (((ON_SubDEdgeSurfaceCurve *)sz9 != (ON_SubDEdgeSurfaceCurve *)0x0) &&
           (((ON_SubDEdgeSurfaceCurve *)sz9)->m_cv_capacity < bVar2)) {
          ReturnEdgeSurfaceCurve(this,desination_edge);
          sz9 = 0;
        }
        if (sz9 == 0) {
          sz9 = (size_t)AllocateEdgeSurfaceCurve(this,local_64);
          if ((ON_SubDEdgeSurfaceCurve *)sz9 == (ON_SubDEdgeSurfaceCurve *)0x0) {
            ON_SubDIncrementErrorCount();
            return (ON_SubDEdgeSurfaceCurve *)0x0;
          }
          if (((ON_SubDEdgeSurfaceCurve *)sz9)->m_cv_capacity < bVar2) {
            ReturnEdgeSurfaceCurve(this,(ON_SubDEdgeSurfaceCurve *)sz9);
            ON_SubDIncrementErrorCount();
            return (ON_SubDEdgeSurfaceCurve *)0x0;
          }
        }
        memcpy((void *)(sz9 + 0x10),local_60->m_cv9,0xd8);
        if (((9 < bVar2) && (*(long *)(sz9 + 0xe8) != 0)) && (local_60->m_cvx != (double *)0x0)) {
          memcpy(*(void **)(sz9 + 0xe8),local_60->m_cvx,(long)(int)(local_64 - 9) * 0x18);
        }
        *(byte *)(sz9 + 8) = bVar2;
        desination_edge->m_limit_curve = (ON_SubDEdgeSurfaceCurve *)sz9;
        ON_SubDComponentBase::Internal_SetSavedSurfacePointFlag
                  (&desination_edge->super_ON_SubDComponentBase,true);
        this_local = (ON_SubDHeap *)sz9;
      }
    }
  }
  return (ON_SubDEdgeSurfaceCurve *)this_local;
}

Assistant:

ON_SubDEdgeSurfaceCurve* ON_SubDHeap::CopyEdgeSurfaceCurve(const ON_SubDEdge* source_edge, const ON_SubDEdge* desination_edge)
{
  if ( nullptr == desination_edge || source_edge == desination_edge)
    return ON_SUBD_RETURN_ERROR(nullptr);

  desination_edge->Internal_ClearSurfacePointFlag();
  if (source_edge->m_limit_curve == desination_edge->m_limit_curve)
    desination_edge->m_limit_curve = nullptr;
  else if (nullptr != desination_edge->m_limit_curve)
    desination_edge->m_limit_curve->m_cv_count = 0;

  if (nullptr == source_edge)
  {
    ReturnEdgeSurfaceCurve(desination_edge);
    return ON_SUBD_RETURN_ERROR(nullptr);
  }

  const ON_SubDEdgeSurfaceCurve* source_curve = source_edge->Internal_SurfacePointFlag() ? source_edge->m_limit_curve : nullptr;
  const unsigned char cv_count = (nullptr != source_curve) ? source_curve->m_cv_count : 0;
  if (0 == cv_count)
  {
    source_edge->Internal_ClearSurfacePointFlag();
    ReturnEdgeSurfaceCurve(desination_edge);
    return nullptr;
  }

  if (cv_count < 2 || cv_count > ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity || (cv_count > ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity && nullptr == source_curve->m_cvx))
  {
    source_edge->Internal_ClearSurfacePointFlag();
    ReturnEdgeSurfaceCurve(desination_edge);
    return ON_SUBD_RETURN_ERROR(nullptr);
  }

  ON_SubDEdgeSurfaceCurve* desination_curve = desination_edge->m_limit_curve;
  if (nullptr != desination_curve && desination_curve->m_cv_capacity < cv_count)
  {
    ReturnEdgeSurfaceCurve(desination_edge);
    desination_curve = nullptr;
  }
  if (nullptr == desination_curve)
  {
    desination_curve = this->AllocateEdgeSurfaceCurve(cv_count);
    if (nullptr == desination_curve)
      return ON_SUBD_RETURN_ERROR(nullptr);
    if (desination_curve->m_cv_capacity < cv_count)
    {
      ReturnEdgeSurfaceCurve(desination_curve);
      return ON_SUBD_RETURN_ERROR(nullptr);
    }
  }
  const size_t sz9 = sizeof(desination_curve->m_cv9);
  memcpy(desination_curve->m_cv9, source_curve->m_cv9, sz9);
  if (cv_count > ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity && nullptr != desination_curve->m_cvx && nullptr != source_curve->m_cvx)
  {
    const size_t szx = ((size_t)(cv_count - ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity)) * 24;
    memcpy(desination_curve->m_cvx, source_curve->m_cvx, szx);
  }
  desination_curve->m_cv_count = cv_count;
  desination_edge->m_limit_curve = desination_curve;
  desination_edge->Internal_SetSavedSurfacePointFlag(true);
  return desination_curve;
}